

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O2

CMbuffer cm_get_data_buf(CManager_conflict cm,ssize_t length)

{
  int iVar1;
  __pid_t _Var2;
  pthread_t pVar3;
  CMbuffer p_Var4;
  void *pvVar5;
  uint uVar6;
  char *__format;
  FILE *pFVar7;
  ulong uVar8;
  CMbuffer *pp_Var9;
  _CMbuffer **pp_Var10;
  CMbuffer *pp_Var11;
  timespec ts;
  
  p_Var4 = cm->cm_buffer_list;
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar1 = CMtrace_init(cm,CMBufferVerbose);
    if (iVar1 == 0) goto LAB_00114bd5;
  }
  else if (CMtrace_val[9] == 0) goto LAB_00114bd5;
  if (CMtrace_PID != 0) {
    pFVar7 = (FILE *)cm->CMTrace_file;
    _Var2 = getpid();
    pVar3 = pthread_self();
    fprintf(pFVar7,"P%lxT%lx - ",(long)_Var2,pVar3);
  }
  if (CMtrace_timing != 0) {
    clock_gettime(1,(timespec *)&ts);
    fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
  }
  fprintf((FILE *)cm->CMTrace_file,"cm_get_data_buf called with len %zu\n",length);
LAB_00114bd5:
  pp_Var11 = &cm->cm_buffer_list;
  fflush((FILE *)cm->CMTrace_file);
  uVar8 = 0;
  for (; p_Var4 != (CMbuffer)0x0; p_Var4 = p_Var4->next) {
    iVar1 = CMtrace_val[9];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar1 = CMtrace_init(cm,CMBufferVerbose);
    }
    if (iVar1 != 0) {
      if (CMtrace_PID != 0) {
        pFVar7 = (FILE *)cm->CMTrace_file;
        _Var2 = getpid();
        pVar3 = pthread_self();
        fprintf(pFVar7,"P%lxT%lx - ",(long)_Var2,pVar3);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&ts);
        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
      }
      fprintf((FILE *)cm->CMTrace_file,"  buffer %d %p, size is %zd, data %p, ref_count %d\n",uVar8,
              p_Var4,p_Var4->size,p_Var4->buffer,p_Var4->ref_count);
    }
    fflush((FILE *)cm->CMTrace_file);
    uVar8 = (ulong)((int)uVar8 + 1);
  }
  uVar6 = 0;
  pp_Var9 = pp_Var11;
  while (p_Var4 = *pp_Var9, pp_Var10 = pp_Var11, p_Var4 != (CMbuffer)0x0) {
    if (p_Var4->ref_count < 0) {
      iVar1 = CMtrace_val[9];
      if (cm->CMTrace_file == (FILE *)0x0) {
        iVar1 = CMtrace_init(cm,CMBufferVerbose);
      }
      if (iVar1 != 0) {
        if (CMtrace_PID != 0) {
          pFVar7 = (FILE *)cm->CMTrace_file;
          _Var2 = getpid();
          pVar3 = pthread_self();
          fprintf(pFVar7,"P%lxT%lx - ",(long)_Var2,pVar3);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)&ts);
          fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
        }
        fprintf((FILE *)cm->CMTrace_file,
                "cm_get_data_buf buffer %p, ref_count is %d, should not be negative\n",p_Var4,
                (ulong)(uint)p_Var4->ref_count);
      }
      fflush((FILE *)cm->CMTrace_file);
    }
    uVar6 = uVar6 + 1;
    pp_Var9 = &p_Var4->next;
  }
  while (p_Var4 = *pp_Var10, pp_Var10 = pp_Var11, p_Var4 != (CMbuffer)0x0) {
    if (((p_Var4->ref_count < 1) && ((ulong)length <= p_Var4->size)) &&
       (p_Var4->size / 10 < (ulong)length)) {
      iVar1 = CMtrace_val[9];
      if (cm->CMTrace_file == (FILE *)0x0) {
        iVar1 = CMtrace_init(cm,CMBufferVerbose);
      }
      if (iVar1 != 0) {
        if (CMtrace_PID != 0) {
          pFVar7 = (FILE *)cm->CMTrace_file;
          _Var2 = getpid();
          pVar3 = pthread_self();
          fprintf(pFVar7,"P%lxT%lx - ",(long)_Var2,pVar3);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)&ts);
          fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
        }
        fprintf((FILE *)cm->CMTrace_file,
                "cm_get_data_buf called len %zu, return existing %p, next %p, count %d\n",length,
                p_Var4,p_Var4->next,(ulong)uVar6);
      }
      fflush((FILE *)cm->CMTrace_file);
      p_Var4->ref_count = 1;
      return p_Var4;
    }
    pp_Var10 = &p_Var4->next;
  }
  while (p_Var4 = *pp_Var10, p_Var4 != (CMbuffer)0x0) {
    if ((p_Var4->ref_count < 1) && ((ulong)length <= p_Var4->size)) {
      pvVar5 = INT_CMrealloc(p_Var4->buffer,length);
      if (pvVar5 == (void *)0x0) {
        return (CMbuffer)0x0;
      }
      p_Var4->buffer = pvVar5;
      p_Var4->size = length;
      p_Var4->ref_count = 1;
      iVar1 = CMtrace_val[9];
      if (cm->CMTrace_file == (FILE *)0x0) {
        iVar1 = CMtrace_init(cm,CMBufferVerbose);
      }
      if (iVar1 == 0) goto LAB_001151f9;
      if (CMtrace_PID != 0) {
        pFVar7 = (FILE *)cm->CMTrace_file;
        _Var2 = getpid();
        pVar3 = pthread_self();
        fprintf(pFVar7,"P%lxT%lx - ",(long)_Var2,pVar3);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&ts);
        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
      }
      pFVar7 = (FILE *)cm->CMTrace_file;
      __format = "      cm_get_data_buf resizing down!  return is %p\n";
      goto LAB_001151ef;
    }
    pp_Var10 = &p_Var4->next;
  }
  do {
    p_Var4 = *pp_Var11;
    if (p_Var4 == (CMbuffer)0x0) {
      pvVar5 = INT_CMmalloc(length);
      p_Var4 = cm_create_transport_buffer(cm,pvVar5,length);
      p_Var4->ref_count = 1;
      p_Var4->next = cm->cm_buffer_list;
      cm->cm_buffer_list = p_Var4;
      iVar1 = CMtrace_val[9];
      if (cm->CMTrace_file == (FILE *)0x0) {
        iVar1 = CMtrace_init(cm,CMBufferVerbose);
      }
      if (iVar1 != 0) {
        if (CMtrace_PID != 0) {
          pFVar7 = (FILE *)cm->CMTrace_file;
          _Var2 = getpid();
          pVar3 = pthread_self();
          fprintf(pFVar7,"P%lxT%lx - ",(long)_Var2,pVar3);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)&ts);
          fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
        }
        fprintf((FILE *)cm->CMTrace_file,"cm_get_data_buf create new len %zu, return %p, count %d\n"
                ,length,p_Var4,(ulong)uVar6);
      }
LAB_001151f9:
      fflush((FILE *)cm->CMTrace_file);
      return p_Var4;
    }
    if ((p_Var4->ref_count < 1) && (p_Var4->size <= (ulong)length)) {
      pvVar5 = INT_CMrealloc(p_Var4->buffer,length);
      if (pvVar5 == (void *)0x0) {
        return (CMbuffer)0x0;
      }
      p_Var4->buffer = pvVar5;
      p_Var4->size = length;
      p_Var4->ref_count = 1;
      iVar1 = CMtrace_val[9];
      if (cm->CMTrace_file == (FILE *)0x0) {
        iVar1 = CMtrace_init(cm,CMBufferVerbose);
      }
      if (iVar1 != 0) {
        if (CMtrace_PID != 0) {
          pFVar7 = (FILE *)cm->CMTrace_file;
          _Var2 = getpid();
          pVar3 = pthread_self();
          fprintf(pFVar7,"P%lxT%lx - ",(long)_Var2,pVar3);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)&ts);
          fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
        }
        pFVar7 = (FILE *)cm->CMTrace_file;
        __format = "      cm_get_data_buf resizingup!  return is %p\n";
LAB_001151ef:
        fprintf(pFVar7,__format,p_Var4);
      }
      goto LAB_001151f9;
    }
    pp_Var11 = &p_Var4->next;
  } while( true );
}

Assistant:

extern CMbuffer
 cm_get_data_buf(CManager cm, ssize_t length)  
 {
     int buffer_count = 0;
     CMbuffer tmp = cm->cm_buffer_list;

     CMtrace_out(cm, CMBufferVerbose, "cm_get_data_buf called with len %zu\n",
		 length);
     while (tmp != NULL) {
	 CMtrace_out(cm, CMBufferVerbose, "  buffer %d %p, size is %zd, data %p, ref_count %d\n",
		     buffer_count, tmp, tmp->size, tmp->buffer, tmp->ref_count);
	 buffer_count++;
	 tmp = tmp->next;
     }

     tmp = cm->cm_buffer_list;
     buffer_count = 0;
     /* first baseline consistency check */
     while (tmp != NULL) {
	 if (tmp->ref_count < 0) {
	     CMtrace_out(cm, CMBufferVerbose, "cm_get_data_buf buffer %p, ref_count is %d, should not be negative\n", tmp, tmp->ref_count);
	 }
	 buffer_count++;
	 tmp = tmp->next;
     }
     /* first look for a buffer big enough, but not too big */
     tmp = cm->cm_buffer_list;
     while (tmp != NULL) {
	 if (tmp->ref_count <= 0) {
	     if ((tmp->size >= (size_t)length) && ((tmp->size/10) < (size_t)length)) {
		 CMtrace_out(cm, CMBufferVerbose, "cm_get_data_buf called len %zu, return existing %p, next %p, count %d\n",
			     length, tmp, tmp->next, buffer_count);
		 tmp->ref_count = 1;
		 return tmp;
	     }
	 }
	 tmp = tmp->next;
     }		
     /* ok, we'll settle for way too big, but realloc it down */
     tmp = cm->cm_buffer_list;
     while (tmp != NULL) {
	 if (tmp->ref_count <= 0) {
	     if ((tmp->size >= (size_t)length)) {
		 char *t = INT_CMrealloc(tmp->buffer, length);
		 if (t == NULL) {
		     return NULL;
		 }
		 tmp->buffer = t;
		 tmp->size = length;
		 tmp->ref_count = 1;
		 CMtrace_out(cm, CMBufferVerbose, "      cm_get_data_buf resizing down!  return is %p\n", tmp);
		 return tmp;
	     }
	 }
	 tmp = tmp->next;
     }		
     tmp = cm->cm_buffer_list;
     /* well, look for a small one to realloc up */
     while (tmp != NULL) {
	 if (tmp->ref_count <= 0) {
	     if (tmp->size <= (size_t)length) {
		 char *t = INT_CMrealloc(tmp->buffer, length);
		 if (t == NULL) {
		     return NULL;
		 }
		 tmp->buffer = t;
		 tmp->size = length;
		 tmp->ref_count = 1;
		 CMtrace_out(cm, CMBufferVerbose, "      cm_get_data_buf resizingup!  return is %p\n", tmp);
		 return tmp;
	     }
	 }
	 tmp = tmp->next;
     }
     tmp = cm_create_transport_buffer(cm, INT_CMmalloc(length), length);
     tmp->ref_count = 1;
     tmp->next = cm->cm_buffer_list;
     cm->cm_buffer_list = tmp;
     CMtrace_out(cm, CMBufferVerbose, "cm_get_data_buf create new len %zu, return %p, count %d\n",
		 length, tmp, buffer_count);
     return tmp;
 }